

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
::internal_emplace<std::pair<int,int>const&>
          (btree<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
           *this,iterator iter,pair<int,_int> *args)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *this_00;
  iterator iVar4;
  iterator iter_local;
  
  this_00 = iter.node;
  iter_local.position = iter.position;
  iter_local.node = this_00;
  bVar1 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::leaf(this_00);
  if (!bVar1) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
    ::decrement(&iter_local);
    iter_local.position = iter_local.position + 1;
    this_00 = iter_local.node;
  }
  bVar2 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::max_count(this_00);
  bVar3 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::count(iter_local.node);
  if (bVar3 == bVar2) {
    if (bVar2 < 0x1e) {
      if (iter_local.node !=
          *(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
            **)this) {
        __assert_fail("iter.node == root()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xc27,
                      "iterator phmap::priv::btree<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>, Args = <const std::pair<int, int> &>]"
                     );
      }
      bVar3 = 0x1e;
      if ((byte)(bVar2 * '\x02') < 0x1e) {
        bVar3 = bVar2 * '\x02';
      }
      iter_local.node =
           btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
           ::new_leaf_root_node
                     ((btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                       *)this,(uint)bVar3);
      btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
      ::swap(iter_local.node,
             *(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
               **)this,(allocator_type *)this);
      btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
      ::delete_leaf_node((btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                          *)this,*(node_type **)this);
      *(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
        **)this = iter_local.node;
      *(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
        **)(this + 8) = iter_local.node;
    }
    else {
      btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
      ::rebalance_or_split
                ((btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                  *)this,&iter_local);
    }
  }
  btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
  ::emplace_value<std::pair<int,int>const&>
            ((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
              *)iter_local.node,(long)iter_local.position,(allocator_type *)this,args);
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  iVar4.position = iter_local.position;
  iVar4.node = iter_local.node;
  iVar4._12_4_ = 0;
  return iVar4;
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }